

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

int ftp_domore_getsock(connectdata *conn,curl_socket_t *socks,int numsocks)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  
  if (numsocks == 0) {
    return 0;
  }
  if ((conn->proto).ftpc.state != FTP_STOP) {
    iVar2 = Curl_pp_getsock(&(conn->proto).ftpc.pp,socks,numsocks);
    return iVar2;
  }
  *socks = conn->sock[0];
  if ((conn->data->set).ftp_use_port != false) {
    socks[1] = conn->sock[1];
    return 0x20003;
  }
  iVar2 = 1;
  lVar5 = 0;
  uVar3 = 1;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    if (conn->tempsock[lVar5] != -1) {
      socks[iVar2] = conn->tempsock[lVar5];
      uVar3 = uVar3 | 1 << ((byte)((char)iVar2 + 0x10) & 0x1f);
      iVar2 = iVar2 + 1;
    }
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  return uVar3;
}

Assistant:

static int ftp_domore_getsock(struct connectdata *conn, curl_socket_t *socks,
                              int numsocks)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(!numsocks)
    return GETSOCK_BLANK;

  /* When in DO_MORE state, we could be either waiting for us to connect to a
   * remote site, or we could wait for that site to connect to us. Or just
   * handle ordinary commands.
   */

  if(FTP_STOP == ftpc->state) {
    int bits = GETSOCK_READSOCK(0);

    /* if stopped and still in this state, then we're also waiting for a
       connect on the secondary connection */
    socks[0] = conn->sock[FIRSTSOCKET];

    if(!conn->data->set.ftp_use_port) {
      int s;
      int i;
      /* PORT is used to tell the server to connect to us, and during that we
         don't do happy eyeballs, but we do if we connect to the server */
      for(s = 1, i = 0; i<2; i++) {
        if(conn->tempsock[i] != CURL_SOCKET_BAD) {
          socks[s] = conn->tempsock[i];
          bits |= GETSOCK_WRITESOCK(s++);
        }
      }
    }
    else {
      socks[1] = conn->sock[SECONDARYSOCKET];
      bits |= GETSOCK_WRITESOCK(1) | GETSOCK_READSOCK(1);
    }

    return bits;
  }
  return Curl_pp_getsock(&conn->proto.ftpc.pp, socks, numsocks);
}